

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

void nni_msg_free(nni_msg *m)

{
  size_t size;
  uint8_t *ptr;
  int iVar1;
  
  if (m != (nni_msg *)0x0) {
    iVar1 = nni_atomic_dec_nv(&m->m_refcnt);
    if (iVar1 == 0) {
      size = (m->m_body).ch_cap;
      if ((size != 0) && (ptr = (m->m_body).ch_buf, ptr != (uint8_t *)0x0)) {
        nni_free(ptr,size);
      }
      (m->m_body).ch_buf = (uint8_t *)0x0;
      (m->m_body).ch_ptr = (uint8_t *)0x0;
      (m->m_body).ch_cap = 0;
      (m->m_body).ch_len = 0;
      nni_free(m,0xf8);
      return;
    }
  }
  return;
}

Assistant:

void
nni_msg_free(nni_msg *m)
{
	if ((m != NULL) && (nni_atomic_dec_nv(&m->m_refcnt) == 0)) {
		nni_chunk_free(&m->m_body);
		NNI_FREE_STRUCT(m);
	}
}